

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BackgroundCommand.cpp
# Opt level: O1

void __thiscall senjo::PerftCommandHandle::Execute(PerftCommandHandle *this)

{
  byte bVar1;
  ChessEngine *pCVar2;
  bool bVar3;
  uint64_t uVar4;
  uint64_t uVar5;
  char cVar6;
  bool bVar7;
  int iVar8;
  int iVar9;
  char *pcVar10;
  undefined4 extraout_var;
  int *piVar11;
  long lVar12;
  timeval *ptVar13;
  timeval *ptVar14;
  FILE *__stream;
  int iVar15;
  int iVar16;
  double dVar17;
  undefined1 auVar18 [16];
  undefined4 uVar22;
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  timeval tv;
  uint64_t nodes;
  uint64_t pcount;
  uint64_t qnodes;
  char fen [16384];
  char local_4099;
  timeval local_4098;
  FILE *local_4088;
  Output local_4080;
  uint64_t local_4078;
  uint64_t local_4070;
  double local_4068;
  double dStack_4060;
  uint64_t local_4050;
  long local_4048;
  long local_4040;
  undefined1 local_4038 [8];
  long local_4030;
  
  pCVar2 = (this->super_BackgroundCommand).engine;
  if (pCVar2 == (ChessEngine *)0x0) {
    Output::Output((Output *)local_4038,InfoPrefix);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Engine not set for \'",0x14);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,(this->command)._M_dataplus._M_p,
               (this->command)._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\' command",9);
  }
  else {
    (*pCVar2->_vptr_ChessEngine[0x1e])();
    if ((this->fileName)._M_string_length == 0) {
      pCVar2 = (this->super_BackgroundCommand).engine;
      if (this->qperft != true) {
        ChessEngine::Perft(pCVar2,this->maxDepth);
        return;
      }
      ChessEngine::QPerft(pCVar2,this->maxDepth);
      return;
    }
    local_4088 = fopen((this->fileName)._M_dataplus._M_p,"r");
    if (local_4088 != (FILE *)0x0) {
      iVar16 = 0;
      gettimeofday((timeval *)local_4038,(__timezone_ptr_t)0x0);
      local_4048 = CONCAT71(local_4038._1_7_,local_4038[0]);
      lVar12 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_4030),8);
      local_4040 = (lVar12 >> 7) - (lVar12 >> 0x3f);
      local_4070 = 0;
      local_4078 = 0;
      local_4050 = 0;
      local_4068 = 0.0;
      iVar15 = 1;
LAB_001425ab:
      pcVar10 = fgets((char *)local_4038,0x4000,local_4088);
      if (pcVar10 != (char *)0x0) {
        ptVar14 = (timeval *)local_4038;
        local_4098.tv_sec = (__time_t)local_4038;
        if (local_4038[0] != '\0') {
          ptVar14 = (timeval *)(local_4038 + 1);
          cVar6 = local_4038[0];
          do {
            ptVar13 = ptVar14;
            iVar8 = isspace((int)cVar6);
            ptVar14 = ptVar13;
            if (iVar8 == 0) break;
            cVar6 = (char)ptVar13->tv_sec;
            ptVar14 = (timeval *)((long)&ptVar13->tv_sec + 1);
            local_4098.tv_sec = (__time_t)ptVar13;
          } while (cVar6 != '\0');
          ptVar14 = (timeval *)((long)&ptVar14[-1].tv_usec + 7);
        }
        bVar7 = false;
        if ((((char)ptVar14->tv_sec != '\0') && ((char)*(__time_t *)local_4098.tv_sec != '#')) &&
           (iVar8 = iVar16 + 1, bVar3 = this->skip <= iVar16, iVar16 = iVar8,
           this->skip < 1 || bVar3)) {
          Output::Output(&local_4080,InfoPrefix);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,(this->fileName)._M_dataplus._M_p,
                     (this->fileName)._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," line ",6);
          std::ostream::operator<<((ostream *)&std::cout,iVar15);
          local_4099 = ' ';
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,&local_4099,1);
          Output::operator<<(&local_4080,(char **)&local_4098);
          Output::~Output(&local_4080);
          ptVar14 = (timeval *)local_4098.tv_sec;
          if ((timeval *)local_4098.tv_sec != (timeval *)0x0) {
            do {
              bVar1 = (byte)ptVar14->tv_sec;
              if (bVar1 < 0x20) {
                if (bVar1 == 0) break;
                if ((bVar1 == 10) || (bVar1 == 0xd)) goto LAB_001426ed;
LAB_001426d9:
                iVar9 = isspace((int)(char)bVar1);
                if (iVar9 != 0) {
                  *(undefined1 *)&ptVar14->tv_sec = 0x20;
                }
              }
              else if (bVar1 != 0x20) goto LAB_001426d9;
              ptVar14 = (timeval *)((long)&ptVar14->tv_sec + 1);
            } while( true );
          }
          goto LAB_001426f0;
        }
        goto LAB_0014260f;
      }
LAB_0014287f:
      gettimeofday(&local_4098,(__timezone_ptr_t)0x0);
      lVar12 = (local_4098.tv_sec - local_4048) * 1000 + local_4098.tv_usec / 1000 + local_4040;
      uVar22 = (undefined4)((ulong)lVar12 >> 0x20);
      if (this->qperft == true) {
        Output::Output((Output *)&local_4098,InfoPrefix);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"Total QPerft ",0xd);
        uVar4 = local_4070;
        std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
        local_4080._vptr_Output._0_1_ = 0x20;
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,(char *)&local_4080,1);
        __stream = local_4088;
        dVar17 = 0.0;
        if (lVar12 != 0) {
          auVar19._8_4_ = uVar22;
          auVar19._0_8_ = lVar12;
          auVar19._12_4_ = 0x45300000;
          dVar17 = ((double)(uVar4 / 1000) /
                   ((auVar19._8_8_ - 1.9342813113834067e+25) +
                   ((double)CONCAT44(0x43300000,(int)lVar12) - 4503599627370496.0))) * 1000.0;
        }
        std::ostream::_M_insert<double>(dVar17);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," KNodes/sec",0xb);
        Output::~Output((Output *)&local_4098);
        Output::Output((Output *)&local_4098,InfoPrefix);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"Total Snodes ",0xd);
        uVar5 = local_4050;
        std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,", Qnodes ",9);
        std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," (",2);
        dVar17 = 0.0;
        if (uVar4 != 0) {
          auVar20._8_4_ = (int)(uVar5 >> 0x20);
          auVar20._0_8_ = uVar5;
          auVar20._12_4_ = 0x45300000;
          auVar21._8_4_ = (int)(uVar4 >> 0x20);
          auVar21._0_8_ = uVar4;
          auVar21._12_4_ = 0x45300000;
          dVar17 = (((auVar20._8_8_ - 1.9342813113834067e+25) +
                    ((double)CONCAT44(0x43300000,(int)uVar5) - 4503599627370496.0)) /
                   ((auVar21._8_8_ - 1.9342813113834067e+25) +
                   ((double)CONCAT44(0x43300000,(int)uVar4) - 4503599627370496.0))) * 100.0;
        }
        std::ostream::_M_insert<double>(dVar17);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"%)",2);
      }
      else {
        Output::Output((Output *)&local_4098,InfoPrefix);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Total Perft ",0xc)
        ;
        uVar4 = local_4070;
        std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
        local_4080._vptr_Output._0_1_ = 0x20;
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,(char *)&local_4080,1);
        auVar18._8_4_ = uVar22;
        auVar18._0_8_ = lVar12;
        auVar18._12_4_ = 0x45300000;
        dStack_4060 = auVar18._8_8_ - 1.9342813113834067e+25;
        local_4068 = dStack_4060 + ((double)CONCAT44(0x43300000,(int)lVar12) - 4503599627370496.0);
        dVar17 = 0.0;
        if (lVar12 != 0) {
          dVar17 = ((double)(uVar4 / 1000) / local_4068) * 1000.0;
        }
        std::ostream::_M_insert<double>(dVar17);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," KLeafs/sec",0xb);
        Output::~Output((Output *)&local_4098);
        Output::Output((Output *)&local_4098,InfoPrefix);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Total Nodes ",0xc)
        ;
        uVar4 = local_4078;
        std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
        local_4080._vptr_Output._0_1_ = 0x20;
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,(char *)&local_4080,1);
        __stream = local_4088;
        dVar17 = 0.0;
        if (lVar12 != 0) {
          dVar17 = ((double)(uVar4 / 1000) / local_4068) * 1000.0;
        }
        std::ostream::_M_insert<double>(dVar17);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," KNodes/sec",0xb);
      }
      Output::~Output((Output *)&local_4098);
      if (__stream == (FILE *)0x0) {
        return;
      }
      fclose(__stream);
      return;
    }
    Output::Output((Output *)local_4038,InfoPrefix);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Cannot open \'",0xd);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,(this->fileName)._M_dataplus._M_p,
               (this->fileName)._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\': ",3);
    piVar11 = __errno_location();
    local_4098.tv_sec = (__time_t)strerror(*piVar11);
    Output::operator<<((Output *)local_4038,(char **)&local_4098);
  }
  Output::~Output((Output *)local_4038);
  return;
LAB_001426ed:
  *(undefined1 *)&ptVar14->tv_sec = 0;
LAB_001426f0:
  if ((timeval *)local_4098.tv_sec != (timeval *)0x0) {
    cVar6 = (char)*(__time_t *)local_4098.tv_sec;
    while (cVar6 != '\0') {
      ptVar14 = (timeval *)((long)&((timeval *)local_4098.tv_sec)->tv_sec + 1);
      iVar9 = isspace((int)cVar6);
      if (iVar9 == 0) break;
      local_4098.tv_sec = (__time_t)ptVar14;
      cVar6 = (char)ptVar14->tv_sec;
    }
  }
  iVar9 = (*((this->super_BackgroundCommand).engine)->_vptr_ChessEngine[9])();
  local_4098.tv_sec = CONCAT44(extraout_var,iVar9);
  if ((timeval *)local_4098.tv_sec == (timeval *)0x0) {
    bVar7 = true;
  }
  else {
    do {
      if (((timeval *)local_4098.tv_sec == (timeval *)0x0) ||
         ((char)*(__time_t *)local_4098.tv_sec == '\0')) break;
      pcVar10 = strchr((char *)local_4098.tv_sec,0x3b);
      if (pcVar10 != (char *)0x0) {
        *pcVar10 = '\0';
      }
      ptVar14 = (timeval *)local_4098.tv_sec;
      if (((timeval *)local_4098.tv_sec != (timeval *)0x0) &&
         (cVar6 = (char)*(__time_t *)local_4098.tv_sec, cVar6 != '\0')) {
        ptVar14 = (timeval *)((long)(__time_t *)local_4098.tv_sec + 1);
        do {
          ptVar13 = ptVar14;
          iVar9 = isspace((int)cVar6);
          ptVar14 = ptVar13;
          if (iVar9 == 0) break;
          cVar6 = (char)ptVar13->tv_sec;
          ptVar14 = (timeval *)((long)&ptVar13->tv_sec + 1);
          local_4098.tv_sec = (__time_t)ptVar13;
        } while (cVar6 != '\0');
        ptVar14 = (timeval *)((long)&ptVar14[-1].tv_usec + 7);
      }
      if (((char)ptVar14->tv_sec == 'D') &&
         ((int)*(char *)((long)(__time_t *)local_4098.tv_sec + 1) - 0x30U < 10)) {
        bVar7 = Process(this,(char *)local_4098.tv_sec,&local_4070,&local_4078,&local_4050);
        dVar17 = (double)((ulong)local_4068 & 0xff);
        if (!bVar7) {
          dVar17 = 4.94065645841247e-324;
        }
        if (pcVar10 != (char *)0x0 && bVar7) {
LAB_001427ec:
          local_4098.tv_sec = (__time_t)(pcVar10 + 1);
          bVar7 = false;
        }
        else {
          bVar7 = true;
          local_4068 = dVar17;
        }
      }
      else {
        if (pcVar10 != (char *)0x0) goto LAB_001427ec;
        bVar7 = true;
      }
    } while (!bVar7);
    bVar7 = this->count <= iVar8 && 0 < this->count;
  }
LAB_0014260f:
  if ((bVar7) || (iVar15 = iVar15 + 1, ((ulong)local_4068 & 1) != 0)) goto LAB_0014287f;
  goto LAB_001425ab;
}

Assistant:

void PerftCommandHandle::Execute()
{
  if (!engine) {
    Output() << "Engine not set for '" << command << "' command";
    return;
  }

  engine->ClearStopFlags();

  if (fileName.empty()) {
    if (qperft) {
      engine->QPerft(maxDepth);
    }
    else {
      engine->Perft(maxDepth);
    }
    return;
  }

  FILE* fp = NULL;
  try {
    if (!(fp = fopen(fileName.c_str(), "r"))) {
      Output() << "Cannot open '" << fileName << "': " << strerror(errno);
      return;
    }

    const uint64_t start = Now();
    uint64_t pcount = 0;
    uint64_t nodes = 0;
    uint64_t qnodes = 0;
    bool done = false;
    char fen[16384];
    int positions = 0;

    for (int line = 1; !done && fgets(fen, sizeof(fen), fp); ++line) {
      char* f = fen;
      if (!*NextWord(f) || (*f == '#')) {
        continue;
      }

      positions++;
      if ((skip > 0) && (positions <= skip)) {
        continue;
      }

      Output() << fileName << " line " << line << ' ' << f;
      NormalizeString(f);
      if (!(f = const_cast<char*>(engine->SetPosition(f)))) {
        break;
      }

      while (f && *f) {
        // null terminate this parameter (parameters end with ; or end of line)
        char* end = strchr(f, ';');
        if (end) {
          *end = 0;
        }

        // process "D<depth> <leafs>" parameters (e.g. D5 4865609)
        if ((*NextWord(f) == 'D') && isdigit(f[1])) {
          if (!Process(f, pcount, nodes, qnodes)) {
            done = true;
            break;
          }
        }

        // move 'f' to beginning of next parameter
        if (end) {
          f = (end + 1);
          continue;
        }
        break;
      }

      if ((count > 0) && (positions >= count)) {
        break;
      }
    }

    const uint64_t time = (Now() - start);
    if (qperft) {
      Output() << "Total QPerft " << pcount << ' '
               << Rate((pcount / 1000), time) << " KNodes/sec";
      Output() << "Total Snodes " << (nodes - qnodes) << ", Qnodes " << qnodes
               << " (" << Percent(qnodes, pcount) << "%)";
    }
    else {
      Output() << "Total Perft " << pcount << ' '
               << Rate((pcount / 1000), time) << " KLeafs/sec";
      Output() << "Total Nodes " << nodes << ' '
               << Rate((nodes / 1000), time) << " KNodes/sec";
    }
  }
  catch (const std::exception& e) {
    Output() << "ERROR: " << e.what();
  }
  catch (...) {
    Output() << "Unknown error!";
  }

  if (fp) {
    fclose(fp);
    fp = NULL;
  }
}